

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

Dict * tagsLookup(TidyDocImpl *doc,TidyTagImpl *tags,ctmbstr s)

{
  uint uVar1;
  int iVar2;
  Dict *pDVar3;
  char *pcVar4;
  char cVar5;
  DictHash *pDVar6;
  Dict *old;
  ulong uVar7;
  
  if (s != (ctmbstr)0x0) {
    cVar5 = *s;
    uVar7 = 0;
    if (cVar5 != '\0') {
      pcVar4 = s + 1;
      do {
        uVar1 = (int)uVar7 * 0x1f + (int)cVar5;
        uVar7 = (ulong)uVar1;
        cVar5 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar5 != '\0');
      uVar7 = (ulong)(uVar1 % 0xb2);
    }
    for (pDVar6 = tags->hashtab[uVar7]; (pDVar6 != (DictHash *)0x0 && (pDVar6->tag != (Dict *)0x0));
        pDVar6 = pDVar6->next) {
      iVar2 = prvTidytmbstrcmp(s,pDVar6->tag->name);
      if (iVar2 == 0) {
        return pDVar6->tag;
      }
    }
    pDVar3 = (Dict *)__tls_get_addr(&PTR_001e6fb0);
    uVar7 = 0;
    do {
      old = pDVar3 + 1;
      iVar2 = prvTidytmbstrcmp(s,pDVar3[1].name);
      if (iVar2 == 0) goto LAB_0013f464;
      uVar7 = uVar7 + 0x40;
      pDVar3 = old;
    } while (uVar7 < 0x2600);
    for (old = tags->declared_tag_list; old != (Dict *)0x0; old = old->next) {
      iVar2 = prvTidytmbstrcmp(s,old->name);
      if (iVar2 == 0) {
LAB_0013f464:
        tagsInstall(doc,tags,old);
        return old;
      }
    }
  }
  return (Dict *)0x0;
}

Assistant:

static const Dict* tagsLookup( TidyDocImpl* doc, TidyTagImpl* tags, ctmbstr s )
{
    const Dict *np;
    const DictHash* p;

    if (!s)
        return NULL;

    /* this breaks if declared elements get changed between two   */
    /* parser runs since Tidy would use the cached version rather */
    /* than the new one.                                          */
    /* However, as FreeDeclaredTags() correctly cleans the hash   */
    /* this should not be true anymore.                           */
    for (p = tags->hashtab[tagsHash(s)]; p && p->tag; p = p->next)
        if (TY_(tmbstrcmp)(s, p->tag->name) == 0)
            return p->tag;

    for (np = tag_defs + 1; np < tag_defs + N_TIDY_TAGS; ++np)
        if (TY_(tmbstrcmp)(s, np->name) == 0)
            return tagsInstall(doc, tags, np);

    for (np = tags->declared_tag_list; np; np = np->next)
        if (TY_(tmbstrcmp)(s, np->name) == 0)
            return tagsInstall(doc, tags, np);

    return NULL;
}